

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_access(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  _Map_pointer ppaVar2;
  _Elt_pointer paVar3;
  proxy *ppVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_00;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> paVar8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar9;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_01;
  ulong uVar10;
  undefined4 extraout_var_03;
  undefined *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  numeric *pnVar13;
  numeric_integer nVar14;
  runtime_error *prVar15;
  any *in_RCX;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  const_iterator cVar19;
  anon_union_16_2_310e9938_for_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  any local_c8;
  any local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  ulong local_a0;
  ulong local_90;
  long local_88;
  long local_80;
  longdouble local_78;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_60;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_58;
  _Head_base<0UL,_cs::numeric_&&,_false> local_50;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_48;
  
  if (b->mDat == (proxy *)0x0) {
    puVar11 = &void::typeinfo;
  }
  else {
    iVar7 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar11 = (undefined *)CONCAT44(extraout_var,iVar7);
  }
  pcVar17 = *(char **)(puVar11 + 8);
  if ((pcVar17 == "St5dequeIN7cs_impl3anyESaIS1_EE") ||
     ((*pcVar17 != '*' && (iVar7 = strcmp(pcVar17,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar7 == 0))))
  {
    if (in_RCX->mDat == (proxy *)0x0) {
      puVar11 = &void::typeinfo;
    }
    else {
      iVar7 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
      puVar11 = (undefined *)CONCAT44(extraout_var_01,iVar7);
    }
    pcVar17 = *(char **)(puVar11 + 8);
    if ((pcVar17 != "N2cs7numericE") &&
       ((*pcVar17 == '*' || (iVar7 = strcmp(pcVar17,"N2cs7numericE"), iVar7 != 0)))) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_e8._int = (numeric_integer)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Index must be a numeric.","");
      runtime_error::runtime_error(prVar15,(string *)&local_e8);
      __cxa_throw(prVar15,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pdVar9 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
    pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    bVar6 = -1 < (pnVar13->data)._int;
    if (pnVar13->type == false) {
      bVar6 = (longdouble)0 <= *(longdouble *)&pnVar13->data;
    }
    pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    bVar1 = pnVar13->type;
    if (bVar6) {
      local_a0 = (ulong)ROUND(*(longdouble *)&pnVar13->data);
      uVar18 = local_a0;
      if (bVar1 != false) {
        uVar18 = (pnVar13->data)._int;
      }
      ppaVar2 = (pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (((long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppaVar2 -
                    (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppaVar2 == (_Map_pointer)0x0)) * 0x40 <= uVar18) {
        this_01 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
        ppaVar2 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_node;
        uVar10 = (ulong)((long)ppaVar2 -
                        (long)(this_01->
                              super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
        lVar16 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                 ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first >> 3);
        if ((((ppaVar2 != (_Map_pointer)0x0) - uVar10) * 0x40 + uVar18) - lVar16 != -1) {
          uVar10 = ~((ulong)(ppaVar2 != (_Map_pointer)0x0) << 6) + lVar16 + uVar10 * 0x40;
          do {
            local_d8._M_local_buf[0] = '\x01';
            local_e8._int = 0;
            std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                      (this_01,(numeric *)&local_e8);
            uVar10 = uVar10 + 1;
          } while (uVar18 != uVar10);
        }
      }
    }
    else {
      if (bVar1 == false) {
        local_78 = -*(longdouble *)&pnVar13->data;
      }
      else {
        local_b8 = -(pnVar13->data)._int;
        uStack_b0 = 0;
        local_78 = (longdouble)(unkuint10)local_b8;
      }
      ppaVar2 = (pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar18 = ((long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppaVar2 -
                         (long)(pdVar9->
                               super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppaVar2 == (_Map_pointer)0x0)) * 0x40;
      bVar6 = (longdouble)(long)uVar18 +
              (longdouble)*(float *)(&DAT_002d2190 + (ulong)((long)uVar18 < 0) * 4) < local_78;
      if (bVar1 != false) {
        bVar6 = uVar18 < local_78._0_8_;
      }
      local_90 = uVar18;
      if (bVar6) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_e8._int = (numeric_integer)&local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Out of range.","");
        runtime_error::runtime_error(prVar15,(string *)&local_e8);
        __cxa_throw(prVar15,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
      lVar16 = (long)ROUND(*(longdouble *)&pnVar13->data);
      if (pnVar13->type != false) {
        lVar16 = (pnVar13->data)._int;
      }
      uVar18 = lVar16 + uVar18;
    }
    paVar3 = (pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    uVar10 = ((long)paVar3 -
              (long)(pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
    if (uVar10 < 0x40) {
      paVar8 = paVar3 + uVar18;
    }
    else {
      uVar18 = uVar10 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar10) {
        uVar18 = uVar10 >> 6;
      }
      paVar8 = (pdVar9->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar18] + uVar10 + uVar18 * -0x40;
    }
  }
  else {
    if (b->mDat == (proxy *)0x0) {
      puVar11 = &void::typeinfo;
    }
    else {
      iVar7 = (*b->mDat->data->_vptr_baseHolder[2])();
      puVar11 = (undefined *)CONCAT44(extraout_var_00,iVar7);
    }
    pcVar17 = *(char **)(puVar11 + 8);
    if ((pcVar17 !=
         "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
        ) && ((*pcVar17 == '*' ||
              (iVar7 = strcmp(pcVar17,
                              "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
                             ), iVar7 != 0)))) {
      if (b->mDat == (proxy *)0x0) {
        puVar11 = &void::typeinfo;
      }
      else {
        iVar7 = (*b->mDat->data->_vptr_baseHolder[2])();
        puVar11 = (undefined *)CONCAT44(extraout_var_02,iVar7);
      }
      pcVar17 = *(char **)(puVar11 + 8);
      if ((pcVar17 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*pcVar17 == '*' ||
          (iVar7 = strcmp(pcVar17,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
          iVar7 != 0)))) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_e8._int = (numeric_integer)&local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Access non-array or string object.","");
        runtime_error::runtime_error(prVar15,(string *)&local_e8);
        __cxa_throw(prVar15,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      if (in_RCX->mDat == (proxy *)0x0) {
        puVar11 = &void::typeinfo;
      }
      else {
        iVar7 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
        puVar11 = (undefined *)CONCAT44(extraout_var_03,iVar7);
      }
      pcVar17 = *(char **)(puVar11 + 8);
      if ((pcVar17 != "N2cs7numericE") &&
         ((*pcVar17 == '*' || (iVar7 = strcmp(pcVar17,"N2cs7numericE"), iVar7 != 0)))) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_e8._int = (numeric_integer)&local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Index must be a numeric.","");
        runtime_error::runtime_error(prVar15,(string *)&local_e8);
        __cxa_throw(prVar15,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      pbVar12 = cs_impl::any::const_val<std::__cxx11::string>(b);
      pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
      bVar6 = -1 < (pnVar13->data)._int;
      if (pnVar13->type == false) {
        bVar6 = (longdouble)0 <= *(longdouble *)&pnVar13->data;
      }
      if (bVar6) {
        pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
        local_88 = (long)ROUND(*(longdouble *)&pnVar13->data);
        nVar14 = local_88;
        if (pnVar13->type != false) {
          nVar14 = (pnVar13->data)._int;
        }
        pcVar17 = (pbVar12->_M_dataplus)._M_p + nVar14;
      }
      else {
        sVar5 = pbVar12->_M_string_length;
        pnVar13 = cs_impl::any::const_val<cs::numeric>(in_RCX);
        local_80 = (long)ROUND(*(longdouble *)&pnVar13->data);
        nVar14 = local_80;
        if (pnVar13->type != false) {
          nVar14 = (pnVar13->data)._int;
        }
        pcVar17 = (pbVar12->_M_dataplus)._M_p + nVar14 + sVar5;
      }
      cs_impl::any::make_constant<char,char_const&>((any *)this,pcVar17);
      return (var)(proxy *)this;
    }
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *)cs_impl::any::
                 const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                           (b);
    cVar19 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ::find<cs_impl::any>(this_00,in_RCX);
    if (cVar19.inner_.ctrl_ == this_00->ctrl_ + this_00->capacity_) {
      local_60 = cs_impl::any::
                 val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                           (b);
      local_c8.mDat = in_RCX->mDat;
      if (local_c8.mDat != (proxy *)0x0) {
        (local_c8.mDat)->refcount = (local_c8.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_c8);
      local_50._M_head_impl = (numeric *)&local_e8;
      local_d8._M_local_buf[0] = '\x01';
      local_e8._int = 0;
      local_58._M_head_impl = &local_c0;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
      ::EmplaceDecomposable::operator()
                (&local_48,&local_60,&local_c0,(piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<cs_impl::any_&&> *)&local_58,(tuple<cs::numeric_&&> *)&local_50);
      cs_impl::any::recycle(&local_c0);
      cs_impl::any::recycle(&local_c8);
    }
    paVar8 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
             ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                         *)this_00,in_RCX);
  }
  ppVar4 = paVar8->mDat;
  if (ppVar4 != (proxy *)0x0) {
    ppVar4->refcount = ppVar4->refcount + 1;
  }
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &ppVar4->is_rvalue;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_access(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &carr = a.const_val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= carr.size()) {
					auto &arr = a.val<array>();
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > carr.size())
					throw runtime_error("Out of range.");
				posit = carr.size() + b.const_val<numeric>().as_integer();
			}
			return carr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			const auto &cmap = a.const_val<hash_map>();
			if (cmap.count(b) == 0)
				a.val<hash_map>().emplace(copy(b), numeric(0));
			return cmap.at(b);
		}
		else if (a.type() == typeid(string)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &cstr = a.const_val<string>();
			if (b.const_val<numeric>() >= 0)
				return var::make_constant<char>(cstr[b.const_val<numeric>().as_integer()]);
			else
				return var::make_constant<char>(cstr[cstr.size() + b.const_val<numeric>().as_integer()]);
		}
		else
			throw runtime_error("Access non-array or string object.");
	}